

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MeshDenoisingViaL0Minimization.cpp
# Opt level: O2

void __thiscall
MeshDenoisingViaL0Minimization::solveDelta
          (MeshDenoisingViaL0Minimization *this,
          vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          *area_based_edge_operator,double lambda,double beta,
          vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          *delta)

{
  double dVar1;
  double dVar2;
  double dVar3;
  pointer pVVar4;
  long lVar5;
  long lVar6;
  double dVar7;
  value_type local_48;
  double local_30;
  double local_28;
  
  local_48.super_VectorDataT<double,_3>.values_[0] = 0.0;
  local_48.super_VectorDataT<double,_3>.values_[1] = 0.0;
  local_48.super_VectorDataT<double,_3>.values_[2] = 0.0;
  local_30 = beta;
  local_28 = lambda;
  std::vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::resize
            (delta,(long)(int)(((long)(area_based_edge_operator->
                                      super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish -
                               (long)(area_based_edge_operator->
                                     super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start) / 0x18),&local_48);
  lVar5 = 0x10;
  for (lVar6 = 0;
      pVVar4 = (area_based_edge_operator->
               super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
      lVar6 < (int)(((long)(area_based_edge_operator->
                           super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar4) / 0x18);
      lVar6 = lVar6 + 1) {
    dVar1 = *(double *)((long)(pVVar4->super_VectorDataT<double,_3>).values_ + lVar5 + -0x10);
    dVar2 = *(double *)((long)(pVVar4->super_VectorDataT<double,_3>).values_ + lVar5 + -8);
    dVar3 = *(double *)((long)(pVVar4->super_VectorDataT<double,_3>).values_ + lVar5);
    dVar7 = SQRT(dVar3 * dVar3 + dVar1 * dVar1 + dVar2 * dVar2);
    if (local_28 / local_30 <= dVar7 * dVar7) {
      pVVar4 = (delta->
               super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      *(double *)((long)(pVVar4->super_VectorDataT<double,_3>).values_ + lVar5 + -0x10) = dVar1;
      *(double *)((long)(pVVar4->super_VectorDataT<double,_3>).values_ + lVar5 + -8) = dVar2;
      *(double *)((long)(pVVar4->super_VectorDataT<double,_3>).values_ + lVar5) = dVar3;
    }
    lVar5 = lVar5 + 0x18;
  }
  return;
}

Assistant:

void MeshDenoisingViaL0Minimization::solveDelta(std::vector<TriMesh::Point> &area_based_edge_operator, double lambda, double beta,
                                                std::vector<TriMesh::Point> &delta)
{
    delta.resize((int)area_based_edge_operator.size(), TriMesh::Point(0.0, 0.0, 0.0));

    for(int i = 0; i < (int)area_based_edge_operator.size(); i++)
    {
        TriMesh::Point pt = area_based_edge_operator[i];
        if(pt.length() * pt.length() >= lambda/beta)
            delta[i] = pt;
    }
}